

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O0

int mpz_cmpabs_d(__mpz_struct *x,double d)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  mp_limb_t local_60;
  double local_58;
  mp_limb_t xl;
  mp_limb_t f;
  mp_size_t i;
  double Bi;
  double B;
  mp_size_t xn;
  double d_local;
  __mpz_struct *x_local;
  
  local_60 = (mp_limb_t)x->_mp_size;
  local_58 = d;
  if (d < 0.0) {
    local_58 = -d;
  }
  xn = (mp_size_t)local_58;
  if (local_60 != 0) {
    if ((long)local_60 < 0) {
      local_60 = -local_60;
    }
    for (f = 1; (long)f < (long)local_60; f = f + 1) {
      xn = (mp_size_t)((double)xn * 5.421010862427522e-20);
    }
    if (1.8446744073709552e+19 <= (double)xn) {
      return -1;
    }
    f = local_60;
    while (0 < (long)f) {
      uVar1 = (long)(double)xn |
              (long)((double)xn - 9.223372036854776e+18) & (long)(double)xn >> 0x3f;
      if (uVar1 < x->_mp_d[f - 1]) {
        return 1;
      }
      if (x->_mp_d[f - 1] < uVar1) {
        return -1;
      }
      auVar2._8_4_ = (int)(uVar1 >> 0x20);
      auVar2._0_8_ = uVar1;
      auVar2._12_4_ = 0x45300000;
      xn = (mp_size_t)
           (((double)xn -
            ((auVar2._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0))) *
           1.8446744073709552e+19);
      f = f - 1;
    }
  }
  return -(uint)(0.0 < (double)xn);
}

Assistant:

int
mpz_cmpabs_d (const mpz_t x, double d)
{
  mp_size_t xn;
  double B, Bi;
  mp_size_t i;

  xn = x->_mp_size;
  d = GMP_ABS (d);

  if (xn != 0)
    {
      xn = GMP_ABS (xn);

      B = 2.0 * (double) GMP_LIMB_HIGHBIT;
      Bi = 1.0 / B;

      /* Scale d so it can be compared with the top limb. */
      for (i = 1; i < xn; i++)
	d *= Bi;

      if (d >= B)
	return -1;

      /* Compare floor(d) to top limb, subtract and cancel when equal. */
      for (i = xn; i-- > 0;)
	{
	  mp_limb_t f, xl;

	  f = (mp_limb_t) d;
	  xl = x->_mp_d[i];
	  if (xl > f)
	    return 1;
	  else if (xl < f)
	    return -1;
	  d = B * (d - f);
	}
    }
  return - (d > 0.0);
}